

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O2

size_t printDisp32(OPTYPE *pMyOperand,size_t i,PDISASM pMyDisasm,long MyNumber)

{
  long lVar1;
  size_t sVar2;
  
  if ((((pMyDisasm->Reserved_).RM_ == 4) && ((pMyDisasm->Reserved_).BASE_ == 4)) &&
     (0x1f < (pMyDisasm->Reserved_).Architecture)) {
    if ((pMyDisasm->Instruction).Opcode == 0x8f) {
      lVar1 = (long)((pMyDisasm->Reserved_).OperandSize / 8);
    }
    else {
      lVar1 = 0;
    }
    MyNumber = MyNumber + lVar1;
  }
  if (MyNumber < 0) {
    (pMyOperand->OpMnemonic + i)[0] = '-';
    (pMyOperand->OpMnemonic + i)[1] = '\0';
    MyNumber = -MyNumber;
  }
  else {
    (pMyOperand->OpMnemonic + i)[0] = '+';
    (pMyOperand->OpMnemonic + i)[1] = '\0';
  }
  sVar2 = CopyFormattedNumber(pMyDisasm,pMyOperand->OpMnemonic + i + 1,"%.8X",MyNumber);
  return sVar2 + i + 1;
}

Assistant:

size_t __bea_callspec__ printDisp32(OPTYPE* pMyOperand, size_t i, PDISASM pMyDisasm, long MyNumber)
{
  size_t j;

  if ((GV.RM_ == 4) && (GV.BASE_ == 4) && (GV.Architecture >=32)) {
    MyNumber += specificPop(pMyDisasm);
  }

  if (MyNumber < 0) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy((char*) pMyOperand->OpMnemonic+i, "-");
      #endif
      i ++;
      j=i;
      #ifndef BEA_LIGHT_DISASSEMBLY
         i+= CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+j,"%.8X",(Int64) ~MyNumber+1);
      #endif
  }
  else {
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy((char*) pMyOperand->OpMnemonic+i, "+");
    #endif
    i ++;
      j = i;
      #ifndef BEA_LIGHT_DISASSEMBLY
         i+= CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+j,"%.8X",(Int64) MyNumber);
      #endif
  }

  return i;
}